

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O0

void __thiscall
ft::treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::transplant
          (treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *this,node *u,node *v)

{
  node *pnVar1;
  node *v_local;
  node *u_local;
  treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *this_local;
  
  pnVar1 = root(this);
  if (u == pnVar1) {
    (this->m_tree).m_root = v;
  }
  else if (u == u->parent->left) {
    u->parent->left = v;
  }
  else if (u == u->parent->right) {
    u->parent->right = v;
  }
  v->parent = u->parent;
  return;
}

Assistant:

void	transplant(node* u, node* v)
	{
		if (u == this->root())
			this->m_tree.m_root = v;
		else if (u == u->parent->left)
			u->parent->left = v;
		else if (u == u->parent->right)
			u->parent->right = v;
		v->parent = u->parent;
	}